

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  size_type sVar1;
  byte bVar2;
  long lVar3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  bVar2 = (byte)this;
  lVar3 = 8;
  do {
    if (*(byte *)((long)&PTR_what_001f7c08 + lVar3) == bVar2) {
      std::__cxx11::string::string
                ((string *)&local_80,*(char **)(&DAT_001f7c10 + lVar3),(allocator *)&local_60);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_80 == &local_70) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_78;
      return __return_storage_ptr__;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x58);
  if (bVar2 < 0x20) {
    to_hex_string_abi_cxx11_(&local_60,(lest *)(ulong)(uint)(int)(char)bVar2,chr);
    local_80 = &local_70;
    paVar5 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == paVar5) {
      local_70._8_8_ = local_60.field_2._8_8_;
    }
    else {
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_60._M_dataplus._M_p;
    }
    local_70._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
    psVar4 = &local_60._M_string_length;
  }
  else {
    paVar5 = &local_30;
    local_40 = paVar5;
    std::__cxx11::string::_M_construct((ulong)&local_40,'\x01');
    local_80 = &local_70;
    if (local_40 == paVar5) {
      local_70._8_8_ = local_30._8_8_;
    }
    else {
      local_80 = local_40;
    }
    local_70._M_allocated_capacity = local_30._M_allocated_capacity;
    psVar4 = &local_38;
  }
  sVar1 = *psVar4;
  (((string *)(psVar4 + -1))->_M_dataplus)._M_p = (pointer)paVar5;
  *psVar4 = 0;
  paVar5->_M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_80 == &local_70) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_78 = 0;
  local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
  if (bVar2 < 0x20) {
    paVar5 = &local_60.field_2;
  }
  else {
    paVar5 = &local_30;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar5->_M_allocated_capacity)[-2] != paVar5) {
    local_80 = &local_70;
    operator_delete((undefined1 *)(&paVar5->_M_allocated_capacity)[-2]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}